

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O0

void Wln_NtkTransferNames(Wln_Ntk_t *pNew,Wln_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  Wln_Ntk_t *p_local;
  Wln_Ntk_t *pNew_local;
  
  if ((pNew->pManName != (Abc_Nam_t *)0x0) || (p->pManName == (Abc_Nam_t *)0x0)) {
    __assert_fail("pNew->pManName == NULL && p->pManName != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                  ,0x113,"void Wln_NtkTransferNames(Wln_Ntk_t *, Wln_Ntk_t *)");
  }
  pNew->pManName = p->pManName;
  p->pManName = (Abc_Nam_t *)0x0;
  iVar1 = Wln_NtkHasCopy(pNew);
  if ((iVar1 != 0) || (iVar1 = Wln_NtkHasCopy(p), iVar1 == 0)) {
    __assert_fail("!Wln_NtkHasCopy(pNew) && Wln_NtkHasCopy(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                  ,0x116,"void Wln_NtkTransferNames(Wln_Ntk_t *, Wln_Ntk_t *)");
  }
  iVar1 = Wln_NtkHasNameId(p);
  if (iVar1 != 0) {
    iVar1 = Wln_NtkHasNameId(pNew);
    if ((iVar1 != 0) || (iVar1 = Wln_NtkHasNameId(p), iVar1 == 0)) {
      __assert_fail("!Wln_NtkHasNameId(pNew) && Wln_NtkHasNameId(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                    ,0x11a,"void Wln_NtkTransferNames(Wln_Ntk_t *, Wln_Ntk_t *)");
    }
    Wln_NtkCleanNameId(pNew);
    for (local_1c = 1; iVar1 = Wln_NtkObjNum(p), local_1c < iVar1; local_1c = local_1c + 1) {
      iVar1 = Wln_ObjCopy(p,local_1c);
      if (((iVar1 != 0) && (iVar1 = Vec_IntSize(&p->vNameIds), local_1c < iVar1)) &&
         (iVar1 = Wln_ObjNameId(p,local_1c), iVar1 != 0)) {
        iVar1 = Wln_ObjCopy(p,local_1c);
        iVar2 = Wln_ObjNameId(p,local_1c);
        Wln_ObjSetNameId(pNew,iVar1,iVar2);
      }
    }
    Vec_IntErase(&p->vNameIds);
  }
  iVar1 = Wln_NtkHasInstId(p);
  if (iVar1 == 0) {
    return;
  }
  iVar1 = Wln_NtkHasInstId(pNew);
  if ((iVar1 == 0) && (iVar1 = Wln_NtkHasInstId(p), iVar1 != 0)) {
    Wln_NtkCleanInstId(pNew);
    for (local_20 = 1; iVar1 = Wln_NtkObjNum(p), local_20 < iVar1; local_20 = local_20 + 1) {
      iVar1 = Wln_ObjCopy(p,local_20);
      if (((iVar1 != 0) && (iVar1 = Vec_IntSize(&p->vInstIds), local_20 < iVar1)) &&
         (iVar1 = Wln_ObjInstId(p,local_20), iVar1 != 0)) {
        iVar1 = Wln_ObjCopy(p,local_20);
        iVar2 = Wln_ObjInstId(p,local_20);
        Wln_ObjSetInstId(pNew,iVar1,iVar2);
      }
    }
    Vec_IntErase(&p->vInstIds);
    return;
  }
  __assert_fail("!Wln_NtkHasInstId(pNew) && Wln_NtkHasInstId(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                ,0x124,"void Wln_NtkTransferNames(Wln_Ntk_t *, Wln_Ntk_t *)");
}

Assistant:

void Wln_NtkTransferNames( Wln_Ntk_t * pNew, Wln_Ntk_t * p )
{
    assert( pNew->pManName  == NULL && p->pManName != NULL );
    pNew->pManName = p->pManName; 
    p->pManName = NULL;
    assert( !Wln_NtkHasCopy(pNew)   && Wln_NtkHasCopy(p)   );
    if ( Wln_NtkHasNameId(p) )
    {
        int i;
        assert( !Wln_NtkHasNameId(pNew) && Wln_NtkHasNameId(p) );
        Wln_NtkCleanNameId( pNew );
        Wln_NtkForEachObj( p, i ) 
            if ( Wln_ObjCopy(p, i) && i < Vec_IntSize(&p->vNameIds) && Wln_ObjNameId(p, i) )
                Wln_ObjSetNameId( pNew, Wln_ObjCopy(p, i), Wln_ObjNameId(p, i) );
        Vec_IntErase( &p->vNameIds );
    }
    if ( Wln_NtkHasInstId(p) )
    {
        int i;
        assert( !Wln_NtkHasInstId(pNew) && Wln_NtkHasInstId(p) );
        Wln_NtkCleanInstId( pNew );
        Wln_NtkForEachObj( p, i ) 
            if ( Wln_ObjCopy(p, i) && i < Vec_IntSize(&p->vInstIds) && Wln_ObjInstId(p, i) )
                Wln_ObjSetInstId( pNew, Wln_ObjCopy(p, i), Wln_ObjInstId(p, i) );
        Vec_IntErase( &p->vInstIds );
    }
}